

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O2

void Gia_ManSetPhase1(Gia_Man_t *p)

{
  Gia_Obj_t *pGVar1;
  int i;
  int iVar2;
  
  iVar2 = 0;
  while ((iVar2 < p->vCis->nSize && (pGVar1 = Gia_ManCi(p,iVar2), pGVar1 != (Gia_Obj_t *)0x0))) {
    pGVar1->field_0x7 = pGVar1->field_0x7 | 0x80;
    iVar2 = iVar2 + 1;
  }
  iVar2 = 0;
  while( true ) {
    if (p->nObjs <= iVar2) {
      return;
    }
    pGVar1 = Gia_ManObj(p,iVar2);
    if (pGVar1 == (Gia_Obj_t *)0x0) break;
    if ((~*(uint *)pGVar1 & 0x9fffffff) != 0) {
      Gia_ObjSetPhase(p,pGVar1);
    }
    iVar2 = iVar2 + 1;
  }
  return;
}

Assistant:

void Gia_ManSetPhase1( Gia_Man_t * p )  
{
    Gia_Obj_t * pObj;
    int i;
    Gia_ManForEachCi( p, pObj, i )
        pObj->fPhase = 1;
    Gia_ManForEachObj( p, pObj, i )
        if ( !Gia_ObjIsCi(pObj) )
            Gia_ObjSetPhase( p, pObj );
}